

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

void adjust_inter_to_priority_list
               (Am_Object *inter,Am_Object *owner,Am_Object *owner_window,bool setting_main_priority
               ,bool multiowner,float main_priority,int second_priority,int third_priority)

{
  bool bVar1;
  Am_Value_Type AVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Priority_List *pAVar5;
  Am_Object *this;
  int local_84;
  Am_Object on_window;
  float local_74;
  Am_Value value;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  pAVar3 = Am_Object::Get(inter,0x68,4);
  Am_Object::Am_Object((Am_Object *)&value,pAVar3);
  bVar1 = Am_Object::Valid((Am_Object *)&value);
  Am_Object::~Am_Object((Am_Object *)&value);
  if (!bVar1) {
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(owner_window);
    Am_Object::Set(inter,0x68,pAVar4,0);
  }
  on_window.data = (Am_Object_Data *)0x0;
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(inter,0x129,5);
  Am_Value::operator=(&value,pAVar3);
  if (value.type == 0xa001) {
    Am_Object::operator=(&on_window,&value);
  }
  if (!multiowner) {
    bVar1 = Am_Object::Valid(&on_window);
    if (bVar1) {
      bVar1 = Am_Object::operator==(&on_window,owner_window);
      if (bVar1) {
        pAVar3 = Am_Object::Get(&on_window,0x124,4);
        pAVar5 = (Am_Priority_List *)Am_Value::operator_cast_to_void_(pAVar3);
        if (setting_main_priority) {
          this = &local_38;
          Am_Object::Am_Object(this,inter);
          Am_Priority_List::Change_Main_Priority(pAVar5,this,main_priority);
        }
        else {
          this = &local_40;
          Am_Object::Am_Object(this,inter);
          Am_Priority_List::Change_Second_Third_Priority(pAVar5,this,second_priority,third_priority)
          ;
        }
        Am_Object::~Am_Object(this);
        goto LAB_001b8051;
      }
    }
  }
  bVar1 = Am_Object::Valid(&on_window);
  if (bVar1) {
    pAVar3 = Am_Object::Get(&on_window,0x124,4);
    pAVar5 = (Am_Priority_List *)Am_Value::operator_cast_to_void_(pAVar3);
    if (pAVar5 != (Am_Priority_List *)0x0) {
      Am_Object::Am_Object(&local_48,inter);
      Am_Priority_List::Delete(pAVar5,&local_48);
      Am_Object::~Am_Object(&local_48);
    }
  }
  if (!multiowner) {
    bVar1 = Am_Object::Valid(owner_window);
    if (bVar1) {
      local_84 = second_priority;
      if (setting_main_priority) {
        AVar2 = Am_Object::Get_Slot_Type(owner,0x86,0);
        if (AVar2 == 2) {
          pAVar3 = Am_Object::Get(owner,0x86,4);
          local_84 = Am_Value::operator_cast_to_int(pAVar3);
        }
        AVar2 = Am_Object::Get_Slot_Type(owner,0x85,0);
        local_74 = main_priority;
        if (AVar2 == 2) {
          pAVar3 = Am_Object::Get(owner,0x85,4);
          third_priority = Am_Value::operator_cast_to_int(pAVar3);
        }
      }
      else {
        pAVar3 = Am_Object::Get(inter,0xcd,4);
        local_74 = Am_Value::operator_cast_to_float(pAVar3);
      }
      if (third_priority == -1 || local_84 == -1) {
        Am_Object::Set(inter,0x129,0,1);
      }
      else {
        Am_Object::Am_Object(&local_50,inter);
        Am_Object::Am_Object(&local_58,owner_window);
        add_priority_list_for_window
                  (&local_50,&local_58,local_74,local_84,third_priority,false,false);
        Am_Object::~Am_Object(&local_58);
        Am_Object::~Am_Object(&local_50);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(owner_window);
        Am_Object::Set(inter,0x129,pAVar4,1);
      }
      goto LAB_001b8051;
    }
  }
  Am_Object::Set(inter,0x129,0,1);
LAB_001b8051:
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&on_window);
  return;
}

Assistant:

void
adjust_inter_to_priority_list(Am_Object &inter, Am_Object &owner,
                              Am_Object &owner_window,
                              bool setting_main_priority, bool multiowner,
                              float main_priority, int second_priority = -1,
                              int third_priority = -1)
{
  //if window slot not set yet, set it
  if (!Am_Object(inter.Get(Am_WINDOW, Am_NO_DEPENDENCY)).Valid())
    inter.Set(Am_WINDOW, owner_window);
  Am_Priority_List *inter_list;
  Am_Object on_window;
  Am_Value value;
  value = inter.Peek(Am_LAST_WINDOW, Am_NO_DEPENDENCY);
  if (value.type == Am_OBJECT)
    on_window = value;

  //std::cout << "......For inter " << inter << " Multiowner " << multiowner
  //      << " old win " << on_window << " new win " << owner_window
  //      <<std::endl <<std::flush;
  if (!multiowner && on_window.Valid() && on_window == owner_window) {
    // then just change priority in place
    inter_list = Am_Priority_List::Narrow(
        on_window.Get(Am_INTER_LIST, Am_NO_DEPENDENCY));
    if (setting_main_priority) {
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Changing main priority of "
                               << inter << " to be " << main_priority << " in "
                               << on_window);
      inter_list->Change_Main_Priority(inter, main_priority);
    } else {
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Changing second/third priority of "
                               << inter << " to be (" << second_priority << ","
                               << third_priority << ") in " << on_window);
      inter_list->Change_Second_Third_Priority(inter, second_priority,
                                               third_priority);
    }
  } else { // don't have an old window or new window is different
    if (on_window.Valid()) {
      // then changing windows, remove from old window
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Removing inter " << inter << " from window "
                                             << on_window);
      inter_list = Am_Priority_List::Narrow(
          on_window.Get(Am_INTER_LIST, Am_NO_DEPENDENCY));
      //std::cout << " ~~~Deleting from inter_list " << inter_list <<std::endl;
      if (inter_list)
        inter_list->Delete(inter); // removes inter if there
    }
    if (!multiowner && owner_window.Valid()) { // then add to new list
      Am_Value_Type typ;
      // second_priority is the Am_OWNER_DEPTH of the graphical object
      // (owner) of the interactor, computed by Opal and third is the Am_RANK
      if (setting_main_priority) {
        // then second and third parameters are bogus, have to Get them
        typ = owner.Get_Slot_Type(Am_OWNER_DEPTH);
        if (typ == Am_INT)
          second_priority = owner.Get(Am_OWNER_DEPTH, Am_NO_DEPENDENCY);
        typ = owner.Get_Slot_Type(Am_RANK);
        if (typ == Am_INT)
          third_priority = owner.Get(Am_RANK, Am_NO_DEPENDENCY);
      } else // need to get main_priority
        main_priority = inter.Get(Am_PRIORITY, Am_NO_DEPENDENCY);
      if (second_priority != -1 && third_priority != -1) {
        add_priority_list_for_window(inter, owner_window, main_priority,
                                     second_priority, third_priority, false,
                                     false);
        inter.Set(Am_LAST_WINDOW, owner_window, Am_OK_IF_NOT_THERE);
      } else
        inter.Set(Am_LAST_WINDOW, 0, Am_OK_IF_NOT_THERE);
    } else
      inter.Set(Am_LAST_WINDOW, 0, Am_OK_IF_NOT_THERE);
  }
}